

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::emit_binary_instruction(Impl *impl,BinaryOperator *instruction)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BinaryOps BVar5;
  uint uVar6;
  Id IVar7;
  Id IVar8;
  Type *pTVar9;
  Value *pVVar10;
  Constant *pCVar11;
  APInt *pAVar12;
  uint64_t uVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  Builder *this;
  Operation *pOVar16;
  Op op;
  bool local_1048;
  Id local_1040;
  Id local_103c;
  char buffer [4096];
  
  BVar5 = LLVMBC::BinaryOperator::getOpcode(instruction);
  switch(BVar5) {
  case Add:
    op = OpIAdd;
    break;
  case FAdd:
    bVar4 = true;
    op = OpFAdd;
    goto LAB_00146e1d;
  case Sub:
    op = OpISub;
    break;
  case FSub:
    bVar4 = true;
    op = OpFSub;
    goto LAB_00146e1d;
  case Mul:
    op = OpIMul;
    break;
  case FMul:
    IVar7 = peephole_trivial_arithmetic_identity(impl,instruction,FDiv,true);
    if (IVar7 != 0) goto LAB_00146fd3;
    bVar4 = true;
    op = OpFMul;
    goto LAB_00146e1d;
  case UDiv:
    op = OpUDiv;
    goto LAB_00146d7f;
  case SDiv:
    op = OpSDiv;
    goto LAB_00146ddd;
  case FDiv:
    IVar7 = peephole_trivial_arithmetic_identity(impl,instruction,FMul,false);
    if (IVar7 != 0) goto LAB_00146fd3;
    bVar1 = false;
    bVar4 = true;
    op = OpFDiv;
    goto LAB_00146e25;
  case URem:
    op = OpUMod;
    goto LAB_00146d7f;
  case SRem:
    op = OpSRem;
    goto LAB_00146ddd;
  case FRem:
    bVar4 = true;
    op = OpFRem;
    goto LAB_00146e1d;
  case Shl:
    op = OpShiftLeftLogical;
    break;
  case LShr:
    op = OpShiftRightLogical;
LAB_00146d7f:
    bVar1 = true;
    bVar4 = false;
    goto LAB_00146e25;
  case AShr:
    op = OpShiftRightArithmetic;
LAB_00146ddd:
    bVar1 = true;
    bVar4 = false;
    local_1048 = true;
    goto LAB_00146e2d;
  case And:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    op = (uint)(uVar6 != 1) * 0x20 + OpLogicalAnd;
    break;
  case Or:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    op = OpBitwiseOr;
    if (uVar6 == 1) {
      op = OpLogicalOr;
    }
    break;
  case Xor:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    if (uVar6 == 1) {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
      pCVar11 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar10)->super_Constant;
      if (pCVar11 == (Constant *)0x0) {
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pCVar11 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar10)->super_Constant;
        uVar6 = 0;
        op = OpLogicalNotEqual;
        if (pCVar11 != (Constant *)0x0) {
          pAVar12 = LLVMBC::Constant::getUniqueInteger(pCVar11);
          uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
          if (uVar13 != 0) goto LAB_00147041;
        }
      }
      else {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(pCVar11);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        if (uVar13 != 0) {
          uVar6 = 1;
LAB_00147041:
          pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar6);
          IVar7 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
          if (IVar7 != 0) {
            bVar4 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)instruction);
            if (bVar4) {
              pTVar9 = LLVMBC::Value::getType((Value *)instruction);
              IVar8 = Converter::Impl::get_type_id(impl,pTVar9,0);
              pOVar16 = Converter::Impl::allocate(impl,OpLogicalNot,IVar8);
            }
            else {
              pOVar16 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)instruction);
            }
            Operation::add_id(pOVar16,IVar7);
            Converter::Impl::add(impl,pOVar16,false);
            IVar7 = pOVar16->id;
            goto LAB_00146fd3;
          }
          bVar4 = false;
          op = OpLogicalNotEqual;
          goto LAB_00146e1d;
        }
        op = OpLogicalNotEqual;
      }
    }
    else {
      op = OpBitwiseXor;
    }
    break;
  default:
    p_Var14 = get_thread_log_callback();
    if (p_Var14 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unknown binary operator.\n",0x22,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer + 0x10,"perator.\n",10);
      builtin_strncpy(buffer,"Unknown binary o",0x10);
      pvVar15 = get_thread_log_callback_userdata();
      (*p_Var14)(pvVar15,Error,buffer);
    }
    IVar7 = 0;
    goto LAB_00146fd3;
  }
  bVar4 = false;
LAB_00146e1d:
  bVar1 = false;
LAB_00146e25:
  local_1048 = false;
LAB_00146e2d:
  IVar8 = 0;
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  bVar2 = instruction_is_undefined_value(pVVar10);
  IVar7 = 1;
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar3 = instruction_is_undefined_value(pVVar10);
  if (bVar2 || bVar3) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)!bVar3);
    IVar8 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  }
  bVar2 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)instruction);
  if (bVar2) {
    IVar7 = IVar8;
    if (IVar8 != 0) goto LAB_00146fd3;
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    IVar7 = Converter::Impl::get_type_id(impl,pTVar9,0);
    pOVar16 = Converter::Impl::allocate(impl,op,IVar7);
  }
  else {
    if (IVar8 != 0) {
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar8);
      goto LAB_00146fd3;
    }
    pOVar16 = Converter::Impl::allocate(impl,op,(Value *)instruction);
  }
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  if (bVar1) {
    IVar7 = build_naturally_extended_value(impl,pVVar10,local_1048);
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_103c = build_naturally_extended_value(impl,pVVar10,local_1048);
  }
  else {
    IVar7 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_103c = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  }
  buffer._0_8_ = &local_1040;
  buffer[8] = '\x02';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_1040 = IVar7;
  Operation::add_ids(pOVar16,(initializer_list<unsigned_int> *)buffer);
  Converter::Impl::add(impl,pOVar16,false);
  if (bVar4) {
    if (((impl->options).force_precise != false) ||
       (bVar4 = LLVMBC::BinaryOperator::isFast(instruction), !bVar4)) {
      this = Converter::Impl::builder(impl);
      spv::Builder::addDecoration(this,pOVar16->id,DecorationNoContraction,-1);
    }
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar9,pOVar16->id,false);
  }
  IVar7 = pOVar16->id;
LAB_00146fd3:
  return IVar7 != 0;
}

Assistant:

bool emit_binary_instruction(Converter::Impl &impl, const llvm::BinaryOperator *instruction)
{
	return emit_binary_instruction_impl(impl, instruction) != 0;
}